

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O3

void __thiscall
pbrt::InstanceSceneEntity::InstanceSceneEntity
          (InstanceSceneEntity *this,string *name,FileLoc loc,
          AnimatedTransform *renderFromInstanceAnim,Transform *renderFromInstance)

{
  ParameterDictionary local_90;
  
  local_90.params.field_2.fixed[0] = (ParsedParameter *)0x0;
  local_90.params.field_2.fixed[1] = (ParsedParameter *)0x0;
  local_90.params.field_2.fixed[2] = (ParsedParameter *)0x0;
  local_90.params.field_2.fixed[3] = (ParsedParameter *)0x0;
  local_90.params.field_2.fixed[4] = (ParsedParameter *)0x0;
  local_90.params.field_2.fixed[5] = (ParsedParameter *)0x0;
  local_90.params.field_2.fixed[6] = (ParsedParameter *)0x0;
  local_90.params.field_2.fixed[7] = (ParsedParameter *)0x0;
  local_90.params.alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_90.params.ptr = (ParsedParameter **)0x0;
  local_90.colorSpace = (RGBColorSpace *)0x0;
  local_90.params.nAlloc = 0;
  local_90.params.nStored = 0;
  SceneEntity::SceneEntity(&this->super_SceneEntity,name,&local_90,loc);
  local_90.params.nStored = 0;
  (*(local_90.params.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_90.params.alloc.memoryResource,local_90.params.ptr,local_90.params.nAlloc << 3,8)
  ;
  memcpy(&this->renderFromInstanceAnim,renderFromInstanceAnim,0x2b8);
  this->renderFromInstance = renderFromInstance;
  return;
}

Assistant:

InstanceSceneEntity(const std::string &name, FileLoc loc,
                        const AnimatedTransform &renderFromInstanceAnim,
                        const Transform *renderFromInstance)
        : SceneEntity(name, {}, loc),
          renderFromInstanceAnim(renderFromInstanceAnim),
          renderFromInstance(renderFromInstance) {}